

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monitor.c
# Opt level: O2

server_extension * server_extension_detect(xcb_connection_t *connection)

{
  _Bool _Var1;
  server_extension_type sVar2;
  server_extension *psVar3;
  xcb_query_extension_reply_t *pxVar4;
  
  psVar3 = (server_extension *)malloc(0x10);
  if (psVar3 != (server_extension *)0x0) {
    pxVar4 = (xcb_query_extension_reply_t *)xcb_get_extension_data(connection,&xcb_randr_id);
    if ((pxVar4 == (xcb_query_extension_reply_t *)0x0) || (sVar2 = RANDR, pxVar4->present == '\0'))
    {
      pxVar4 = (xcb_query_extension_reply_t *)xcb_get_extension_data(connection,&xcb_xinerama_id);
      if ((pxVar4 == (xcb_query_extension_reply_t *)0x0) ||
         ((pxVar4->present == '\0' || (_Var1 = xinerama_is_active(connection), !_Var1)))) {
        sVar2 = NO_EXTENSION;
        pxVar4 = (xcb_query_extension_reply_t *)0x0;
      }
      else {
        sVar2 = XINERAMA;
      }
    }
    psVar3->type = sVar2;
    psVar3->data_cache = pxVar4;
    return psVar3;
  }
  return (server_extension *)0x0;
}

Assistant:

struct server_extension *server_extension_detect(xcb_connection_t *connection)
{
        struct server_extension *extension = malloc(sizeof(struct server_extension));

        if (extension == NULL) {
                return NULL;
        }

        const xcb_query_extension_reply_t *cache = XCB_NONE;

        cache = xcb_get_extension_data(connection, &xcb_randr_id);

        if (cache && cache->present) {
                extension->type = RANDR;
                extension->data_cache = cache;

                return extension;
        }

        cache = xcb_get_extension_data(connection, &xcb_xinerama_id);

        if ((cache && cache->present) && xinerama_is_active(connection)) {
                extension->type = XINERAMA;
                extension->data_cache = cache;

                return extension;
        }

        extension->type = NO_EXTENSION;
        extension->data_cache = NULL;

        return extension;
}